

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Types.h
# Opt level: O0

void __thiscall glslang::TType::TType(TType *this,TType *type,int derefIndex,bool rowMajor)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  undefined4 extraout_var;
  TArraySizes *this_00;
  vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_> *this_01;
  const_reference pvVar4;
  TType *s;
  TTypeList *memberList;
  bool rowMajor_local;
  int derefIndex_local;
  TType *type_local;
  TType *this_local;
  
  this->_vptr_TType = (_func_int **)&PTR__TType_010d8758;
  uVar2 = (*type->_vptr_TType[0x1d])();
  if ((uVar2 & 1) == 0) {
    if (((*(uint *)&type->field_0x8 & 0xff) == 0xf) || ((*(uint *)&type->field_0x8 & 0xff) == 0x10))
    {
      this_01 = &getStruct(type)->
                 super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>;
      pvVar4 = std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>::
               operator[](this_01,(long)derefIndex);
      shallowCopy(this,pvVar4->type);
    }
    else {
      shallowCopy(this,type);
      if ((*(uint *)&this->field_0x8 >> 0xc & 0xf) == 0) {
        uVar2 = (*this->_vptr_TType[0x1b])();
        if ((uVar2 & 1) == 0) {
          bVar1 = isCoopMat(this);
          if ((bVar1) || (bVar1 = isCoopVecNV(this), bVar1)) {
            *(uint *)&this->field_0x8 = *(uint *)&this->field_0x8 & 0xffdfffff;
            *(uint *)&this->field_0x8 = *(uint *)&this->field_0x8 & 0xffbfffff;
            *(uint *)&this->field_0x8 = *(uint *)&this->field_0x8 & 0xfc7fffff;
            *(uint *)&this->field_0x8 = *(uint *)&this->field_0x8 & 0xfbffffff;
            *(uint *)&this->field_0x8 = *(uint *)&this->field_0x8 & 0xf7ffffff;
            this->typeParameters = (TTypeParameters *)0x0;
          }
        }
        else {
          *(uint *)&this->field_0x8 = *(uint *)&this->field_0x8 & 0xfffff0ff | 0x100;
          *(uint *)&this->field_0x8 = *(uint *)&this->field_0x8 & 0xffefffff;
        }
      }
      else {
        if (rowMajor) {
          *(uint *)&this->field_0x8 =
               *(uint *)&this->field_0x8 & 0xfffff0ff |
               (*(uint *)&this->field_0x8 >> 0xc & 0xf) << 8;
        }
        else {
          *(uint *)&this->field_0x8 =
               *(uint *)&this->field_0x8 & 0xfffff0ff |
               (*(uint *)&this->field_0x8 >> 0x10 & 0xf) << 8;
        }
        *(uint *)&this->field_0x8 = *(uint *)&this->field_0x8 & 0xffff0fff;
        *(uint *)&this->field_0x8 = *(uint *)&this->field_0x8 & 0xfff0ffff;
        if ((*(uint *)&this->field_0x8 >> 8 & 0xf) == 1) {
          *(uint *)&this->field_0x8 = *(uint *)&this->field_0x8 & 0xffefffff | 0x100000;
        }
      }
    }
  }
  else {
    s = type;
    shallowCopy(this,type);
    iVar3 = (*type->_vptr_TType[0x13])();
    iVar3 = TArraySizes::getNumDims((TArraySizes *)CONCAT44(extraout_var,iVar3));
    if (iVar3 == 1) {
      this->arraySizes = (TArraySizes *)0x0;
    }
    else {
      this_00 = (TArraySizes *)TArraySizes::operator_new((TArraySizes *)0x18,(size_t)s);
      TArraySizes::TArraySizes(this_00);
      this->arraySizes = this_00;
      TArraySizes::copyDereferenced(this->arraySizes,type->arraySizes);
    }
  }
  return;
}

Assistant:

TType(const TType& type, int derefIndex, bool rowMajor = false)
                            {
                                if (type.isArray()) {
                                    shallowCopy(type);
                                    if (type.getArraySizes()->getNumDims() == 1) {
                                        arraySizes = nullptr;
                                    } else {
                                        // want our own copy of the array, so we can edit it
                                        arraySizes = new TArraySizes;
                                        arraySizes->copyDereferenced(*type.arraySizes);
                                    }
                                } else if (type.basicType == EbtStruct || type.basicType == EbtBlock) {
                                    // do a structure dereference
                                    const TTypeList& memberList = *type.getStruct();
                                    shallowCopy(*memberList[derefIndex].type);
                                    return;
                                } else {
                                    // do a vector/matrix dereference
                                    shallowCopy(type);
                                    if (matrixCols > 0) {
                                        // dereference from matrix to vector
                                        if (rowMajor)
                                            vectorSize = matrixCols;
                                        else
                                            vectorSize = matrixRows;
                                        matrixCols = 0;
                                        matrixRows = 0;
                                        if (vectorSize == 1)
                                            vector1 = true;
                                    } else if (isVector()) {
                                        // dereference from vector to scalar
                                        vectorSize = 1;
                                        vector1 = false;
                                    } else if (isCoopMat() || isCoopVecNV()) {
                                        coopmatNV = false;
                                        coopmatKHR = false;
                                        coopmatKHRuse = 0;
                                        coopmatKHRUseValid = false;
                                        coopvecNV = false;
                                        typeParameters = nullptr;
                                    }
                                }
                            }